

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

VarValue *
deqp::gles31::Functional::generateRandomVarValue
          (VarValue *__return_storage_ptr__,DataType type,Random *rnd,int samplerUnit)

{
  uint uVar1;
  deUint32 dVar2;
  deBool dVar3;
  DataType dataType;
  DataType DVar4;
  int iVar5;
  ulong uVar6;
  float fVar7;
  
  uVar1 = glu::getDataTypeScalarSize(type);
  __return_storage_ptr__->type = type;
  if ((type - TYPE_FLOAT < 4) || (type - TYPE_FLOAT_MAT2 < 9 || type - TYPE_DOUBLE_MAT2 < 9)) {
    if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        fVar7 = deRandom_getFloat(&rnd->m_rnd);
        *(float *)((long)&__return_storage_ptr__->val + uVar6 * 4) = fVar7 * 20.0 + -10.0;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  else if (type - TYPE_INT < 4) {
    if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        dVar2 = deRandom_getUint32(&rnd->m_rnd);
        *(uint *)((long)&__return_storage_ptr__->val + uVar6 * 4) = dVar2 % 0x15 - 10;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  else if (type - TYPE_UINT < 4) {
    if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        dVar2 = deRandom_getUint32(&rnd->m_rnd);
        *(deUint32 *)((long)&__return_storage_ptr__->val + uVar6 * 4) =
             dVar2 - (dVar2 / 0xb + (dVar2 / 0xb) * 10);
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  else if (type - TYPE_BOOL < 4) {
    if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        dVar3 = deRandom_getBool(&rnd->m_rnd);
        (__return_storage_ptr__->val).boolV[uVar6] = dVar3 == 1;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  else if (type - TYPE_SAMPLER_1D < 0x1e) {
    dataType = getSamplerLookupReturnType(type);
    DVar4 = glu::getDataTypeScalarType(dataType);
    uVar1 = glu::getDataTypeScalarSize(dataType);
    (__return_storage_ptr__->val).samplerV.unit = samplerUnit;
    if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        if (DVar4 == TYPE_UINT) {
          dVar2 = deRandom_getUint32(&rnd->m_rnd);
          iVar5 = dVar2 - (dVar2 / 0xb + (dVar2 / 0xb) * 10);
LAB_01579dad:
          *(int *)((long)&__return_storage_ptr__->val + uVar6 * 4 + 4) = iVar5;
        }
        else {
          if (DVar4 == TYPE_INT) {
            dVar2 = deRandom_getUint32(&rnd->m_rnd);
            iVar5 = dVar2 % 0x15 - 10;
            goto LAB_01579dad;
          }
          if (DVar4 == TYPE_FLOAT) {
            fVar7 = deRandom_getFloat(&rnd->m_rnd);
            *(float *)((long)&__return_storage_ptr__->val + uVar6 * 4 + 4) = fVar7 + 0.0;
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static VarValue generateRandomVarValue (const glu::DataType type, Random& rnd, int samplerUnit = -1 /* Used if type is a sampler type. \note Samplers' unit numbers are not randomized. */)
{
	const int	numElems = glu::getDataTypeScalarSize(type);
	VarValue	result;
	result.type = type;

	DE_ASSERT((samplerUnit >= 0) == (glu::isDataTypeSampler(type)));

	if (glu::isDataTypeFloatOrVec(type) || glu::isDataTypeMatrix(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.floatV[i] = rnd.getFloat(-10.0f, 10.0f);
	}
	else if (glu::isDataTypeIntOrIVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.intV[i] = rnd.getInt(-10, 10);
	}
	else if (glu::isDataTypeUintOrUVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.uintV[i] = (deUint32)rnd.getInt(0, 10);
	}
	else if (glu::isDataTypeBoolOrBVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.boolV[i] = rnd.getBool();
	}
	else if (glu::isDataTypeSampler(type))
	{
		const glu::DataType		texResultType		= getSamplerLookupReturnType(type);
		const glu::DataType		texResultScalarType	= glu::getDataTypeScalarType(texResultType);
		const int				texResultNumDims	= glu::getDataTypeScalarSize(texResultType);

		result.val.samplerV.unit = samplerUnit;

		for (int i = 0; i < texResultNumDims; i++)
		{
			switch (texResultScalarType)
			{
				case glu::TYPE_FLOAT:	result.val.samplerV.fillColor.floatV[i]		= rnd.getFloat(0.0f, 1.0f);		break;
				case glu::TYPE_INT:		result.val.samplerV.fillColor.intV[i]		= rnd.getInt(-10, 10);			break;
				case glu::TYPE_UINT:	result.val.samplerV.fillColor.uintV[i]		= (deUint32)rnd.getInt(0, 10);	break;
				default:
					DE_ASSERT(false);
			}
		}
	}
	else
		DE_ASSERT(false);

	return result;
}